

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

int uECC_verify(uint8_t *public_key,uint8_t *hash,uint8_t *signature)

{
  uint64_t *Z1;
  ulong *puVar1;
  uECC_word_t *puVar2;
  int iVar3;
  uint uVar4;
  uECC_word_t borrow;
  uECC_word_t *puVar5;
  uECC_word_t *puVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  bool bVar14;
  uECC_word_t local_258;
  uECC_word_t product [8];
  EccPoint sum;
  uECC_word_t tz [4];
  EccPoint public;
  uECC_word_t u1 [4];
  uECC_word_t u2 [4];
  uECC_word_t ry [4];
  uECC_word_t s [4];
  uECC_word_t tx [4];
  uECC_word_t ty [4];
  uECC_word_t r [4];
  uECC_word_t z [4];
  uECC_word_t rx [4];
  EccPoint *points [4];
  
  lVar12 = 0;
  r[2] = 0;
  s[2] = 0;
  vli_bytesToNative(tz + 3,public_key);
  vli_bytesToNative(public.x + 3,public_key + 0x20);
  vli_bytesToNative(ty + 3,signature);
  vli_bytesToNative(ry + 3,signature + 0x20);
  while (ty[lVar12 + 3] == 0) {
    lVar12 = lVar12 + 1;
    if (lVar12 == 4) {
      return 0;
    }
  }
  lVar12 = 0;
  while (ry[lVar12 + 3] == 0) {
    lVar12 = lVar12 + 1;
    if (lVar12 == 4) {
      return 0;
    }
  }
  uVar8 = 3;
  puVar5 = curve_n;
  while( true ) {
    iVar3 = (int)uVar8;
    puVar1 = curve_n + uVar8;
    lVar12 = uVar8 + 3;
    if (ty[lVar12] < *puVar1) break;
    uVar8 = (ulong)(iVar3 - 1);
    if (iVar3 == 0) {
      return 0;
    }
    if (*puVar1 < ty[lVar12]) {
      return 0;
    }
  }
  uVar8 = 3;
  while( true ) {
    iVar3 = (int)uVar8;
    puVar1 = curve_n + uVar8;
    lVar12 = uVar8 + 3;
    if (ry[lVar12] < *puVar1) break;
    uVar8 = (ulong)(iVar3 - 1);
    if (iVar3 == 0) {
      return 0;
    }
    if (*puVar1 < ry[lVar12]) {
      return 0;
    }
  }
  puVar2 = r + 3;
  vli_modInv(puVar2,ry + 3,curve_n);
  puVar6 = public.y + 3;
  u1[2] = 0;
  vli_bytesToNative(puVar6,hash);
  vli_modMult_n(puVar6,puVar6,puVar2);
  vli_modMult_n(u1 + 3,ty + 3,puVar2);
  sum.x[1] = public.x[1];
  sum.x[2] = public.x[2];
  product[7] = tz[3];
  sum.x[0] = public.x[0];
  sum.x[3] = public.x[3];
  sum.y[0] = public.y[0];
  sum.y[1] = public.y[1];
  sum.y[2] = public.y[2];
  s[3] = 0xf4a13945d898c296;
  tx[0] = 0x77037d812deb33a0;
  tx[1] = 0xf8bce6e563a440f2;
  tx[2] = 0x6b17d1f2e12c4247;
  tx[3] = 0xcbb6406837bf51f5;
  ty[0] = 0x2bce33576b315ece;
  ty[1] = 0x8ee7eb4a7c0f9e16;
  ty[2] = 0x4fe342e2fe1a7f9b;
  puVar6 = product + 7;
  vli_modSub(puVar2,puVar6,s + 3,puVar5);
  XYcZ_add(s + 3,tx + 3,puVar6,sum.x + 3);
  vli_modInv(puVar2,puVar2,curve_p);
  apply_z(puVar6,sum.x + 3,puVar2);
  rx[3] = 0;
  uVar4 = 3;
  iVar3 = -0x100;
LAB_0011819f:
  uVar8 = public.y[(ulong)uVar4 + 3];
  if (uVar8 == 0) goto code_r0x001181ae;
  lVar12 = 0x3f;
  if (uVar8 != 0) {
    for (; uVar8 >> lVar12 == 0; lVar12 = lVar12 + -1) {
    }
  }
  iVar3 = -(((uint)lVar12 ^ 0x3f) + iVar3);
  goto LAB_001181c4;
code_r0x001181ae:
  uVar4 = uVar4 - 1;
  iVar3 = iVar3 + 0x40;
  if (iVar3 == 0) goto code_r0x001181b5;
  goto LAB_0011819f;
code_r0x001181b5:
  iVar3 = 0;
LAB_001181c4:
  uVar4 = 3;
  iVar7 = -0x100;
LAB_001181ce:
  uVar8 = u1[(ulong)uVar4 + 3];
  if (uVar8 == 0) goto code_r0x001181dd;
  lVar12 = 0x3f;
  if (uVar8 != 0) {
    for (; uVar8 >> lVar12 == 0; lVar12 = lVar12 + -1) {
    }
  }
  iVar7 = -(((uint)lVar12 ^ 0x3f) + iVar7);
  goto LAB_001181f3;
code_r0x001181dd:
  uVar4 = uVar4 - 1;
  iVar7 = iVar7 + 0x40;
  if (iVar7 == 0) goto code_r0x001181e4;
  goto LAB_001181ce;
code_r0x001181e4:
  iVar7 = 0;
LAB_001181f3:
  if (iVar7 < iVar3) {
    iVar7 = iVar3;
  }
  uVar8 = (ulong)(iVar7 - 1U);
  lVar12 = (long)((int)(iVar7 - 1U) >> 6);
  lVar12 = *(long *)((long)rx +
                    (ulong)((uint)((u1[lVar12 + 3] >> (uVar8 & 0x3f) & 1) != 0) * 0x10 +
                           (uint)((public.y[lVar12 + 3] >> (uVar8 & 0x3f) & 1) != 0) * 8) + 0x18);
  lVar9 = 0;
  do {
    z[lVar9 + 3] = *(uECC_word_t *)(lVar12 + lVar9 * 8);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  u2[3] = *(uECC_word_t *)(lVar12 + 0x20);
  ry[0] = *(uECC_word_t *)(lVar12 + 0x28);
  ry[1] = *(uECC_word_t *)(lVar12 + 0x30);
  ry[2] = *(uECC_word_t *)(lVar12 + 0x38);
  z[0] = 0;
  z[1] = 0;
  z[2] = 0;
  r[3] = 1;
  if (1 < iVar7) {
    puVar5 = z + 3;
    Z1 = r + 3;
    do {
      iVar3 = (int)uVar8;
      uVar13 = iVar3 - 1;
      EccPoint_double_jacobian(puVar5,u2 + 3,Z1);
      uVar4 = (uint)((u1[(ulong)(uVar13 >> 6) + 3] >> ((ulong)uVar13 & 0x3f) & 1) != 0) * 0x10;
      puVar6 = (uECC_word_t *)(ulong)uVar4;
      puVar2 = *(uECC_word_t **)
                ((long)rx +
                (ulong)(uVar4 + (uint)((public.y[(ulong)(uVar13 >> 6) + 3] >> ((ulong)uVar13 & 0x3f)
                                       & 1) != 0) * 8) + 0x18);
      if (puVar2 != (uECC_word_t *)0x0) {
        s[3] = *puVar2;
        tx[0] = puVar2[1];
        tx[1] = puVar2[2];
        tx[2] = puVar2[3];
        tx[3] = puVar2[4];
        ty[0] = puVar2[5];
        ty[1] = puVar2[6];
        ty[2] = puVar2[7];
        apply_z(s + 3,tx + 3,Z1);
        vli_modSub(sum.y + 3,puVar5,s + 3,puVar6);
        XYcZ_add(s + 3,tx + 3,puVar5,u2 + 3);
        vli_mult(&local_258,Z1,sum.y + 3);
        vli_mmod_fast(Z1,&local_258);
      }
      uVar8 = (ulong)(iVar3 - 1U);
    } while (iVar3 - 1U != 0 && 0 < iVar3);
  }
  puVar5 = r + 3;
  vli_modInv(puVar5,puVar5,curve_p);
  apply_z(z + 3,u2 + 3,puVar5);
  uVar4 = 3;
  do {
    uVar8 = (ulong)uVar4;
    uVar10 = (ulong)uVar4;
    if (z[uVar10 + 3] < curve_n[uVar8]) goto LAB_001183fd;
    bVar14 = uVar4 != 0;
    uVar4 = uVar4 - 1;
  } while ((bVar14) && (z[uVar10 + 3] <= curve_n[uVar8]));
  lVar12 = 0;
  uVar8 = 0;
  do {
    uVar11 = *(long *)((long)curve_n + lVar12) + uVar8;
    puVar1 = (ulong *)((long)z + lVar12 + 0x18);
    uVar10 = *puVar1;
    *puVar1 = *puVar1 - uVar11;
    if (uVar11 != 0) {
      uVar8 = (ulong)(uVar10 < uVar11);
    }
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x20);
LAB_001183fd:
  lVar12 = 3;
  uVar8 = 0;
  do {
    uVar8 = uVar8 | ty[lVar12 + 3] ^ z[lVar12 + 3];
    bVar14 = lVar12 != 0;
    lVar12 = lVar12 + -1;
  } while (bVar14);
  return (uint)(uVar8 == 0);
}

Assistant:

int uECC_verify(const uint8_t public_key[uECC_BYTES*2],
                const uint8_t hash[uECC_BYTES],
                const uint8_t signature[uECC_BYTES*2]) {
    uECC_word_t u1[uECC_N_WORDS], u2[uECC_N_WORDS];
    uECC_word_t z[uECC_N_WORDS];
    EccPoint public, sum;
    uECC_word_t rx[uECC_WORDS];
    uECC_word_t ry[uECC_WORDS];
    uECC_word_t tx[uECC_WORDS];
    uECC_word_t ty[uECC_WORDS];
    uECC_word_t tz[uECC_WORDS];
    const EccPoint *points[4];
    const EccPoint *point;
    bitcount_t numBits;
    bitcount_t i;
    uECC_word_t r[uECC_N_WORDS], s[uECC_N_WORDS];
    r[uECC_N_WORDS - 1] = 0;
    s[uECC_N_WORDS - 1] = 0;

    vli_bytesToNative(public.x, public_key);
    vli_bytesToNative(public.y, public_key + uECC_BYTES);
    vli_bytesToNative(r, signature);
    vli_bytesToNative(s, signature + uECC_BYTES);

    if (vli_isZero(r) || vli_isZero(s)) { /* r, s must not be 0. */
        return 0;
    }

#if (uECC_CURVE != uECC_secp160r1)
    if (vli_cmp(curve_n, r) != 1 || vli_cmp(curve_n, s) != 1) { /* r, s must be < n. */
        return 0;
    }
#endif

    /* Calculate u1 and u2. */
    vli_modInv_n(z, s, curve_n); /* Z = s^-1 */
    u1[uECC_N_WORDS - 1] = 0;
    vli_bytesToNative(u1, hash);
    vli_modMult_n(u1, u1, z); /* u1 = e/s */
    vli_modMult_n(u2, r, z); /* u2 = r/s */

    /* Calculate sum = G + Q. */
    vli_set(sum.x, public.x);
    vli_set(sum.y, public.y);
    vli_set(tx, curve_G.x);
    vli_set(ty, curve_G.y);
    vli_modSub_fast(z, sum.x, tx); /* Z = x2 - x1 */
    XYcZ_add(tx, ty, sum.x, sum.y);
    vli_modInv(z, z, curve_p); /* Z = 1/Z */
    apply_z(sum.x, sum.y, z);

    /* Use Shamir's trick to calculate u1*G + u2*Q */
    points[0] = 0;
    points[1] = &curve_G;
    points[2] = &public;
    points[3] = &sum;
    numBits = smax(vli_numBits(u1, uECC_N_WORDS), vli_numBits(u2, uECC_N_WORDS));

    point = points[(!!vli_testBit(u1, numBits - 1)) | ((!!vli_testBit(u2, numBits - 1)) << 1)];
    vli_set(rx, point->x);
    vli_set(ry, point->y);
    vli_clear(z);
    z[0] = 1;

    for (i = numBits - 2; i >= 0; --i) {
        uECC_word_t index;
        EccPoint_double_jacobian(rx, ry, z);

        index = (!!vli_testBit(u1, i)) | ((!!vli_testBit(u2, i)) << 1);
        point = points[index];
        if (point) {
            vli_set(tx, point->x);
            vli_set(ty, point->y);
            apply_z(tx, ty, z);
            vli_modSub_fast(tz, rx, tx); /* Z = x2 - x1 */
            XYcZ_add(tx, ty, rx, ry);
            vli_modMult_fast(z, z, tz);
        }
    }

    vli_modInv(z, z, curve_p); /* Z = 1/Z */
    apply_z(rx, ry, z);

    /* v = x1 (mod n) */
#if (uECC_CURVE != uECC_secp160r1)
    if (vli_cmp(curve_n, rx) != 1) {
        vli_sub(rx, rx, curve_n);
    }
#endif

    /* Accept only if v == r. */
    return vli_equal(rx, r);
}